

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sym.cpp
# Opt level: O3

void * __thiscall StackSym::GetConstAddress(StackSym *this,bool useLocal)

{
  OpCode OVar1;
  _func_int **pp_Var2;
  code *pcVar3;
  bool bVar4;
  OpndKind OVar5;
  uint uVar6;
  undefined4 *puVar7;
  long lVar8;
  Opnd *this_00;
  Instr *instr;
  
  VerifyConstFlags(this);
  if ((this->field_0x18 & 8) == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x292,"(this->IsConst())","this->IsConst()");
    if (!bVar4) goto LAB_0062bb66;
    *puVar7 = 0;
  }
  instr = (this->field_5).m_instrDef;
  this_00 = instr->m_src1;
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 == OpndKindReg) {
    OVar5 = IR::Opnd::GetKind(this_00);
    if (OVar5 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar4) goto LAB_0062bb66;
      *puVar7 = 0;
    }
    pp_Var2 = this_00[1]._vptr_Opnd;
    uVar6 = *(uint *)(pp_Var2 + 3);
    if ((uVar6 & 0x40) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x29b,"(!stackSym->m_isEncodedConstant)","!stackSym->m_isEncodedConstant")
      ;
      if (!bVar4) goto LAB_0062bb66;
      *puVar7 = 0;
      uVar6 = *(uint *)(pp_Var2 + 3);
    }
    if ((uVar6 & 1) != 0) {
      instr = (Instr *)pp_Var2[5];
      this_00 = instr->m_src1;
    }
  }
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar5 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                       ,0x2a4,"(src1->IsAddrOpnd())","src1->IsAddrOpnd()");
    if (!bVar4) goto LAB_0062bb66;
    *puVar7 = 0;
  }
  OVar1 = instr->m_opcode;
  if (((OVar1 != Ld_A) && (OVar1 != ArgOut_A_InlineBuiltIn)) && (OVar1 != LdStr)) {
    bVar4 = LowererMD::IsAssign(instr);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.cpp"
                         ,0x2a5,
                         "(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr))"
                         ,
                         "defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr)"
                        );
      if (!bVar4) goto LAB_0062bb66;
      *puVar7 = 0;
    }
  }
  OVar5 = IR::Opnd::GetKind(this_00);
  if (useLocal) {
    lVar8 = 0x18;
    if (OVar5 == OpndKindAddr) goto LAB_0062bb53;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar4) {
LAB_0062bb66:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    lVar8 = 0x18;
  }
  else {
    lVar8 = 0x20;
    if (OVar5 == OpndKindAddr) goto LAB_0062bb53;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar4) goto LAB_0062bb66;
    lVar8 = 0x20;
  }
  *puVar7 = 0;
LAB_0062bb53:
  return *(void **)((long)&this_00->_vptr_Opnd + lVar8);
}

Assistant:

void *StackSym::GetConstAddress(bool useLocal /*= false*/) const
{
    Assert(this->IsConst());
    IR::Instr *defInstr = this->m_instrDef;
    IR::Opnd *src1 = defInstr->GetSrc1();

    StackSym * stackSym = nullptr;

    if (src1->IsRegOpnd())
    {
        stackSym = src1->AsRegOpnd()->m_sym;
        Assert(!stackSym->m_isEncodedConstant);
        if (stackSym->m_isSingleDef)
        {
            //In ARM constant load is always legalized. Try to get the constant from src def
            defInstr = stackSym->m_instrDef;
            src1 = defInstr->GetSrc1();
        }
    }

    Assert(src1->IsAddrOpnd());
    Assert(defInstr->m_opcode == Js::OpCode::Ld_A || defInstr->m_opcode == Js::OpCode::LdStr || defInstr->m_opcode == Js::OpCode::ArgOut_A_InlineBuiltIn || LowererMD::IsAssign(defInstr));
    return useLocal ? src1->AsAddrOpnd()->m_localAddress : src1->AsAddrOpnd()->m_address;
}